

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O0

void anon_unknown.dwarf_46d210::handle_io<curious_read_record>
               (curious_callback_type_t type,void *usr_data,curious_read_record *record)

{
  bool bVar1;
  Variant VVar2;
  undefined1 local_78 [8];
  Variant mount_point_var;
  Variant filesystem_var;
  user_data_t *data;
  Caliper c;
  curious_read_record *record_local;
  void *usr_data_local;
  curious_callback_type_t type_local;
  
  (anonymous_namespace)::num_io_callbacks = (anonymous_namespace)::num_io_callbacks + 1;
  c._24_8_ = record;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool((Caliper *)&data);
  if ((bVar1) && (bVar1 = cali::Channel::is_active((Channel *)((long)usr_data + 8)), bVar1)) {
    if ((type & 1U) == 0) {
      VVar2 = make_variant(*(char **)(c._24_8_ + 0x10));
      mount_point_var.m_v.value.v_uint = VVar2.m_v.type_and_size;
      VVar2 = make_variant(*(char **)(c._24_8_ + 0x18));
      mount_point_var.m_v.type_and_size = (uint64_t)VVar2.m_v.value;
      local_78 = (undefined1  [8])VVar2.m_v.type_and_size;
      cali::Caliper::begin
                ((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_mount_point_attr,
                 (Variant *)local_78);
      cali::Caliper::begin
                ((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_filesystem_attr,
                 (Variant *)&mount_point_var.m_v.value);
      cali::Caliper::begin
                ((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_region_attr,
                 (Variant *)((anonymous_namespace)::categories + (long)(type >> 1) * 0x10));
    }
    else {
      handle_unique_record_data
                ((Caliper *)&data,(Channel *)((long)usr_data + 8),(curious_read_record_t *)c._24_8_)
      ;
      cali::Caliper::end((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_region_attr);
      cali::Caliper::end((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_filesystem_attr);
      cali::Caliper::end((Caliper *)&data,(Attribute *)&(anonymous_namespace)::io_mount_point_attr);
    }
  }
  else {
    (anonymous_namespace)::num_failed_io_callbacks =
         (anonymous_namespace)::num_failed_io_callbacks + 1;
  }
  cali::Caliper::~Caliper((Caliper *)&data);
  return;
}

Assistant:

void handle_io(curious_callback_type_t type, void* usr_data, Record* record)
{
    ++num_io_callbacks;

    // get a Caliper instance

    Caliper c    = Caliper::sigsafe_instance();
    auto    data = static_cast<user_data_t*>(usr_data);

    // If we got a Caliper instance successfully...
    if (c && data->channel.is_active()) {
        // ...mark the end...
        if (type & CURIOUS_POST_CALLBACK) {
            handle_unique_record_data(c, data->channel, record);

            c.end(io_region_attr);
            c.end(io_filesystem_attr);
            c.end(io_mount_point_attr);

            // ...or begining of the I/O region, as appropriate
        } else {
            Variant filesystem_var  = make_variant(record->filesystem);
            Variant mount_point_var = make_variant(record->mount_point);

            c.begin(io_mount_point_attr, mount_point_var);
            c.begin(io_filesystem_attr, filesystem_var);
            c.begin(io_region_attr, categories[GET_CATEGORY(type)]);
        }

        // ...otherwise not our failure (probably already inside Caliper)
    } else {
        ++num_failed_io_callbacks;
    }
}